

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_ObjDup(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int Id;
  Wlc_Obj_t *pWVar1;
  
  pWVar1 = Wlc_NtkObj(p,iObj);
  Id = Wlc_ObjAlloc(pNew,*(ushort *)pWVar1 & 0x3f,*(ushort *)pWVar1 >> 6 & 1,pWVar1->End,pWVar1->Beg
                   );
  pWVar1 = Wlc_NtkObj(pNew,Id);
  Wlc_ObjCollectCopyFanins(p,iObj,vFanins);
  Wlc_ObjAddFanins(pNew,pWVar1,vFanins);
  Vec_IntWriteEntry(&p->vCopies,iObj,Id);
  return Id;
}

Assistant:

int Wlc_ObjDup( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    int iFaninNew = Wlc_ObjAlloc( pNew, pObj->Type, Wlc_ObjIsSigned(pObj), pObj->End, pObj->Beg );
    Wlc_Obj_t * pObjNew = Wlc_NtkObj(pNew, iFaninNew);
    Wlc_ObjCollectCopyFanins( p, iObj, vFanins );
    Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
    Wlc_ObjSetCopy( p, iObj, iFaninNew );
    return iFaninNew;
}